

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Primitive.cpp
# Opt level: O0

void __thiscall Primitive::input(Primitive *this,string *var,stringstream *fin)

{
  bool bVar1;
  istream *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string file;
  Vector3 *in_stack_ffffffffffffff48;
  string *this_00;
  string local_a8 [64];
  Mat *in_stack_ffffffffffffff98;
  Picture *in_stack_ffffffffffffffa0;
  string local_38 [32];
  istream *local_18;
  
  local_18 = in_RDX;
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    operator>>((stringstream *)in_RDI,in_stack_ffffffffffffff48);
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    operator>>((stringstream *)in_RDI,in_stack_ffffffffffffff48);
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    std::istream::operator>>(local_18,(double *)(in_RDI + 0x40));
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    std::istream::operator>>(local_18,(double *)(in_RDI + 0x48));
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    std::istream::operator>>(local_18,(double *)(in_RDI + 0x50));
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    std::istream::operator>>(local_18,(double *)(in_RDI + 0x58));
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    std::istream::operator>>(local_18,(double *)(in_RDI + 0x60));
  }
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    this_00 = local_38;
    std::__cxx11::string::string(this_00);
    std::operator>>(local_18,this_00);
    cv::imread(local_a8,(int)local_38);
    Picture::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    cv::Mat::~Mat((Mat *)local_a8);
    if (*(long *)(in_RDI + 0x70) == 0) {
      __assert_fail("texture.data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Primitive.cpp"
                    ,0x12,"virtual void Primitive::input(const std::string &, std::stringstream &)")
      ;
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Primitive::input(const std::string &var, std::stringstream &fin) {
    if ( var == "color=" ) fin >> color;
    if ( var == "absor=" ) fin >> absor;
    if ( var == "refl=" ) fin >> refl;
    if ( var == "refr=" ) fin >> refr;
    if ( var == "diff=" ) fin >> diff;
    if ( var == "spec=" ) fin >> spec;
    if ( var == "rindex=" ) fin >> rindex;
    if ( var == "texture=" ) {
        std::string file; fin >> file;
        texture = imread(file);
        assert(texture.data != NULL);
    }
}